

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

void __thiscall ncnn::Layer_final::set_layer_properties(Layer_final *this)

{
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000088;
  vector<int,_std::allocator<int>_> *in_stack_00000090;
  
  *(undefined8 *)(*(long *)(in_RDI + 0xd0) + 0x20) = *(undefined8 *)(in_RDI + 0x20);
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_00000090,
             (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_00000088);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_00000090,
             (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_00000088);
  *(undefined4 *)(*(long *)(in_RDI + 0xd0) + 0x1c) = *(undefined4 *)(in_RDI + 0x1c);
  return;
}

Assistant:

void set_layer_properties()
    {
        layer_cpu->userdata = userdata;

        layer_cpu->bottoms = bottoms;
        layer_cpu->tops = tops;
        layer_cpu->bottom_shapes = bottom_shapes;
        layer_cpu->top_shapes = top_shapes;
        layer_cpu->featmask = featmask;

#if NCNN_VULKAN
        if (layer_vulkan)
        {
            layer_vulkan->vkdev = vkdev;

            layer_vulkan->userdata = userdata;

            layer_vulkan->bottoms = bottoms;
            layer_vulkan->tops = tops;
            layer_vulkan->bottom_shapes = bottom_shapes;
            layer_vulkan->top_shapes = top_shapes;
            layer_vulkan->featmask = featmask;
        }
#endif
    }